

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomNumberGenerator.cc
# Opt level: O1

void __thiscall
OpenMesh::RandomNumberGenerator::RandomNumberGenerator
          (RandomNumberGenerator *this,size_t _resolution)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  this->resolution_ = _resolution;
  this->iterations_ = 1;
  this->maxNum_ = 2147483648.0;
  if (0x80000000 < _resolution) {
    auVar5._8_4_ = (int)(_resolution >> 0x20);
    auVar5._0_8_ = _resolution;
    auVar5._12_4_ = 0x45300000;
    dVar4 = (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)_resolution) - 4503599627370496.0);
    sVar1 = 1;
    do {
      sVar1 = sVar1 + 1;
      dVar4 = dVar4 * 4.656612873077393e-10;
    } while (2147483648.0 < dVar4);
    this->iterations_ = sVar1;
  }
  if (this->iterations_ != 1) {
    dVar4 = this->maxNum_;
    uVar2 = 1;
    do {
      dVar4 = dVar4 * 2147483648.0;
      uVar3 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar3 < this->iterations_ - 1);
    this->maxNum_ = dVar4;
  }
  return;
}

Assistant:

RandomNumberGenerator::RandomNumberGenerator(const size_t _resolution) :
  resolution_(_resolution),
  iterations_(1),
  maxNum_(RAND_MAX + 1.0)
{
  double tmp = double(resolution_);
  while (tmp > (double(RAND_MAX) + 1.0) ) {
    iterations_++;
    tmp /= (double(RAND_MAX) + 1.0);
  }

  for ( unsigned int i = 0 ; i < iterations_ - 1; ++i ) {
    maxNum_ *= (RAND_MAX + 1.0);
  }
}